

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O0

pair<unsigned_int,_unsigned_int>
deqp::gls::anon_unknown_1::createAndAttachShaders
          (TestLog *log,RenderContext *renderCtx,deUint32 program,
          vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
          *attributes,bool attributeAliasing)

{
  bool bVar1;
  bool fragmentCompileOk_00;
  int iVar2;
  GLenum GVar3;
  deBool dVar4;
  undefined4 extraout_var;
  TestError *pTVar5;
  deUint32 shader;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  *attributes_00;
  undefined1 local_f0 [8];
  string fragmentShaderInfoLog;
  string vertexShaderInfoLog;
  bool fragmentCompileOk;
  GLchar *pGStack_a8;
  bool vertexCompileOk;
  char *fragmentShaderString;
  char *vertexShaderString;
  GLuint local_90;
  deUint32 fragmentShader;
  deUint32 vertexShader;
  undefined1 local_80 [8];
  string fragmentShaderSource;
  string vertexShaderSource;
  Functions *gl;
  bool attributeAliasing_local;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  *attributes_local;
  deUint32 program_local;
  RenderContext *renderCtx_local;
  TestLog *log_local;
  Functions *gl_00;
  
  bVar1 = attributeAliasing;
  iVar2 = (*renderCtx->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  attributes_00 =
       (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
        *)(ulong)(attributeAliasing & 1);
  gls::(anonymous_namespace)::createVertexShaderSource_abi_cxx11_
            ((string *)((long)&fragmentShaderSource.field_2 + 8),(_anonymous_namespace_ *)renderCtx,
             (RenderContext *)attributes,attributes_00,bVar1);
  gls::(anonymous_namespace)::createFragmentShaderSource_abi_cxx11_
            ((string *)local_80,(_anonymous_namespace_ *)renderCtx,
             (RenderContext *)(ulong)(attributeAliasing & 1),SUB81(attributes_00,0));
  local_90 = (*gl_00->createShader)(0x8b31);
  vertexShaderString._4_4_ = (*gl_00->createShader)(0x8b30);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glCreateShader()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x1a7);
  fragmentShaderString = (char *)std::__cxx11::string::c_str();
  pGStack_a8 = (GLchar *)std::__cxx11::string::c_str();
  (*gl_00->shaderSource)(local_90,1,&fragmentShaderString,(GLint *)0x0);
  (*gl_00->shaderSource)(vertexShaderString._4_4_,1,&stack0xffffffffffffff58,(GLint *)0x0);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glShaderSource()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x1b0);
  (*gl_00->compileShader)(local_90);
  (*gl_00->compileShader)(vertexShaderString._4_4_);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glCompileShader()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x1b5);
  (*gl_00->attachShader)(program,local_90);
  (*gl_00->attachShader)(program,vertexShaderString._4_4_);
  GVar3 = (*gl_00->getError)();
  shader = 0x1b9;
  glu::checkError(GVar3,"glAttachShader()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x1b9);
  bVar1 = getShaderCompileStatus(gl_00,local_90);
  fragmentCompileOk_00 = getShaderCompileStatus(gl_00,vertexShaderString._4_4_);
  gls::(anonymous_namespace)::getShaderInfoLog_abi_cxx11_
            ((string *)((long)&fragmentShaderInfoLog.field_2 + 8),(_anonymous_namespace_ *)gl_00,
             (Functions *)(ulong)local_90,shader);
  gls::(anonymous_namespace)::getShaderInfoLog_abi_cxx11_
            ((string *)local_f0,(_anonymous_namespace_ *)gl_00,
             (Functions *)(ulong)vertexShaderString._4_4_,shader);
  logShaders(log,(string *)((long)&fragmentShaderSource.field_2 + 8),
             (string *)((long)&fragmentShaderInfoLog.field_2 + 8),bVar1,(string *)local_80,
             (string *)local_f0,fragmentCompileOk_00);
  while ((dVar4 = ::deGetFalse(), dVar4 == 0 && (bVar1))) {
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      while ((dVar4 = ::deGetFalse(), dVar4 == 0 && (fragmentCompileOk_00))) {
        dVar4 = ::deGetFalse();
        if (dVar4 == 0) {
          std::__cxx11::string::~string((string *)local_f0);
          std::__cxx11::string::~string((string *)(fragmentShaderInfoLog.field_2._M_local_buf + 8));
          (*gl_00->deleteShader)(local_90);
          (*gl_00->deleteShader)(vertexShaderString._4_4_);
          std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
                    ((pair<unsigned_int,_unsigned_int> *)&log_local,&local_90,
                     (uint *)((long)&vertexShaderString + 4));
          std::__cxx11::string::~string((string *)local_80);
          std::__cxx11::string::~string((string *)(fragmentShaderSource.field_2._M_local_buf + 8));
          return (pair<unsigned_int,_unsigned_int>)log_local;
        }
      }
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Fragment shader compilation failed","fragmentCompileOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                 ,0x1c5);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,"Vertex shader compilation failed","vertexCompileOk",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
             ,0x1c4);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

pair<deUint32, deUint32> createAndAttachShaders (TestLog& log, glu::RenderContext& renderCtx, deUint32 program, const vector<Attribute>& attributes, bool attributeAliasing)
{
	const glw::Functions&	gl						= renderCtx.getFunctions();
	const string			vertexShaderSource		= createVertexShaderSource(renderCtx, attributes, attributeAliasing);
	const string			fragmentShaderSource	= createFragmentShaderSource(renderCtx, attributeAliasing);

	const deUint32			vertexShader			= gl.createShader(GL_VERTEX_SHADER);
	const deUint32			fragmentShader			= gl.createShader(GL_FRAGMENT_SHADER);

	try
	{
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader()");

		{
			const char* const vertexShaderString	= vertexShaderSource.c_str();
			const char* const fragmentShaderString	= fragmentShaderSource.c_str();

			gl.shaderSource(vertexShader, 1, &vertexShaderString, DE_NULL);
			gl.shaderSource(fragmentShader, 1, &fragmentShaderString, DE_NULL);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource()");
		}

		gl.compileShader(vertexShader);
		gl.compileShader(fragmentShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader()");

		gl.attachShader(program, vertexShader);
		gl.attachShader(program, fragmentShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader()");

		{
			const bool		vertexCompileOk			= getShaderCompileStatus(gl, vertexShader);
			const bool		fragmentCompileOk		= getShaderCompileStatus(gl, fragmentShader);

			const string	vertexShaderInfoLog		= getShaderInfoLog(gl, vertexShader);
			const string	fragmentShaderInfoLog	= getShaderInfoLog(gl, fragmentShader);

			logShaders(log, vertexShaderSource, vertexShaderInfoLog, vertexCompileOk, fragmentShaderSource, fragmentShaderInfoLog, fragmentCompileOk);

			TCU_CHECK_MSG(vertexCompileOk, "Vertex shader compilation failed");
			TCU_CHECK_MSG(fragmentCompileOk, "Fragment shader compilation failed");
		}

		gl.deleteShader(vertexShader);
		gl.deleteShader(fragmentShader);

		return pair<deUint32, deUint32>(vertexShader, fragmentShader);
	}
	catch (...)
	{
		if (vertexShader != 0)
			gl.deleteShader(vertexShader);

		if (fragmentShader != 0)
			gl.deleteShader(fragmentShader);

		throw;
	}
}